

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void recognize_face(Mat *face,Net *net,vector<float,_std::allocator<float>_> *fv)

{
  iterator __position;
  long lVar1;
  long lVar2;
  Mat vec;
  Mat probMat;
  Mat blob;
  ulong *local_168;
  undefined8 uStack_160;
  ulong local_158 [10];
  undefined8 *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_a8;
  _InputArray *local_a0;
  undefined8 local_98;
  _InputArray local_90 [4];
  
  local_158[0] = 0;
  local_168 = (ulong *)CONCAT44(local_168._4_4_,0x1010000);
  local_a8 = 0x6000000060;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = (undefined8 *)0x0;
  uStack_100 = 0;
  uStack_160 = face;
  cv::dnn::dnn4_v20211004::blobFromImage
            (local_90,0.00392156862745098,(Size_ *)&local_168,(Scalar_ *)&local_a8,
             SUB81(&local_108,0),true,0);
  local_98 = 0;
  local_a8 = CONCAT44(local_a8._4_4_,0x1010000);
  local_108 = &local_f8;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  local_158[0] = 0;
  local_158[1] = 0;
  local_168 = (ulong *)0x0;
  uStack_160 = (Mat *)0x0;
  cv::dnn::dnn4_v20211004::Net::setInput
            ((_InputArray *)net,(string *)&local_a8,1.0,(Scalar_ *)&local_108);
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  uStack_160 = (Mat *)0x0;
  local_158[0] = local_158[0] & 0xffffffffffffff00;
  local_168 = local_158;
  cv::dnn::dnn4_v20211004::Net::forward((string *)&local_108);
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  cv::Mat::reshape((int)&local_168,(int)&local_108);
  if (0 < uStack_160._4_4_) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      __position._M_current =
           (fv->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (fv->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)fv,__position,
                   (float *)(local_158[0] + lVar1));
      }
      else {
        *__position._M_current = *(float *)(local_158[0] + lVar1);
        (fv->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 4;
    } while (lVar2 < uStack_160._4_4_);
  }
  cv::Mat::~Mat((Mat *)&local_168);
  cv::Mat::~Mat((Mat *)&local_108);
  cv::Mat::~Mat((Mat *)local_90);
  return;
}

Assistant:

void recognize_face(Mat& face, Net net, vector<float> &fv){
    Mat blob = blobFromImage(face, 1/255.0, Size(96, 96),
            Scalar(0, 0, 0), true, false);
    net.setInput(blob);
    Mat probMat = net.forward();
    Mat vec = probMat.reshape(1, 1);

    for(int i = 0; i < vec.cols; i++){
        fv.push_back(vec.at<float>(0, i));
    }
}